

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_index_tree.cpp
# Opt level: O2

void __thiscall duckdb::WindowIndexTreeLocalState::BuildLeaves(WindowIndexTreeLocalState *this)

{
  DataChunk *this_00;
  idx_t iVar1;
  WindowIndexTree *pWVar2;
  type global_sort_state;
  reference pvVar3;
  reference pvVar4;
  pointer this_01;
  Elements *pEVar5;
  pointer this_02;
  size_t __n;
  data_ptr_t __src;
  long lVar6;
  value_type vVar7;
  PayloadScanner scanner;
  PayloadScanner PStack_48;
  
  global_sort_state =
       unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
       operator*(&(this->index_tree->super_WindowMergeSortTree).global_sort);
  if ((global_sort_state->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (global_sort_state->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    PayloadScanner::PayloadScanner
              (&PStack_48,global_sort_state,(this->super_WindowMergeSortTreeLocalState).build_task,
               false);
    pvVar3 = vector<unsigned_long,_true>::get<true>
                       (&(this->index_tree->super_WindowMergeSortTree).block_starts,
                        (this->super_WindowMergeSortTreeLocalState).build_task);
    vVar7 = *pvVar3;
    this_00 = &(this->super_WindowMergeSortTreeLocalState).payload_chunk;
    while( true ) {
      DataChunk::Reset(this_00);
      PayloadScanner::Scan(&PStack_48,this_00);
      iVar1 = (this->super_WindowMergeSortTreeLocalState).payload_chunk.count;
      if (iVar1 == 0) break;
      pvVar4 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,0);
      pWVar2 = this->index_tree;
      if ((pWVar2->super_WindowMergeSortTree).mst32.
          super_unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
          .
          super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_*,_false>
          ._M_head_impl ==
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *)0x0) {
        this_02 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
                  ::operator->(&(pWVar2->super_WindowMergeSortTree).mst64);
        pEVar5 = (Elements *)
                 MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
                 LowestLevel(this_02);
        __src = pvVar4->data;
        __n = iVar1 * 8;
        lVar6 = vVar7 * 8;
      }
      else {
        this_01 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
                  ::operator->(&(pWVar2->super_WindowMergeSortTree).mst32);
        pEVar5 = MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::
                 LowestLevel(this_01);
        __src = pvVar4->data;
        __n = iVar1 * 4;
        lVar6 = vVar7 * 4;
      }
      memmove((void *)(lVar6 + (long)(pEVar5->
                                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start),__src,__n);
      vVar7 = vVar7 + iVar1;
    }
    PayloadScanner::~PayloadScanner(&PStack_48);
  }
  return;
}

Assistant:

void WindowIndexTreeLocalState::BuildLeaves() {
	auto &global_sort = *index_tree.global_sort;
	if (global_sort.sorted_blocks.empty()) {
		return;
	}

	PayloadScanner scanner(global_sort, build_task);
	idx_t row_idx = index_tree.block_starts[build_task];
	for (;;) {
		payload_chunk.Reset();
		scanner.Scan(payload_chunk);
		const auto count = payload_chunk.size();
		if (count == 0) {
			break;
		}
		auto &indices = payload_chunk.data[0];
		if (index_tree.mst32) {
			auto &sorted = index_tree.mst32->LowestLevel();
			auto data = FlatVector::GetData<uint32_t>(indices);
			std::copy(data, data + count, sorted.data() + row_idx);
		} else {
			auto &sorted = index_tree.mst64->LowestLevel();
			auto data = FlatVector::GetData<uint64_t>(indices);
			std::copy(data, data + count, sorted.data() + row_idx);
		}
		row_idx += count;
	}
}